

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_Disasm.c
# Opt level: O2

size_t printArg4(PDISASM pMyDisasm,size_t i)

{
  int iVar1;
  size_t sVar2;
  
  iVar1 = (pMyDisasm->Reserved_).MemDecoration;
  if (iVar1 - 0x12dU < 0x62) {
    (pMyDisasm->Reserved_).MemDecoration = iVar1 + -300;
    sVar2 = printDecoratedArg(&pMyDisasm->Operand4,pMyDisasm,i);
    return sVar2;
  }
  sVar2 = printArg(&pMyDisasm->Operand4,pMyDisasm,i);
  return sVar2;
}

Assistant:

size_t __bea_callspec__ printArg4(PDISASM pMyDisasm, size_t i)
{
  if ((GV.MemDecoration >300) && (GV.MemDecoration < 399)) {
    GV.MemDecoration -= 300;
    i = printDecoratedArg(&pMyDisasm->Operand4, pMyDisasm, i);
  }
  else {
    i = printArg(&pMyDisasm->Operand4, pMyDisasm, i);
  }
  return i;
}